

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversionTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::InversionTypesSectionParser::InversionTypesSectionParser
          (InversionTypesSectionParser *this,ForceFieldOptions *param_1)

{
  allocator<char> local_31;
  string local_30 [32];
  
  (this->super_SectionParser).sectionName_._M_dataplus._M_p =
       (pointer)&(this->super_SectionParser).sectionName_.field_2;
  (this->super_SectionParser).sectionName_._M_string_length = 0;
  (this->super_SectionParser).sectionName_.field_2._M_local_buf[0] = '\0';
  (this->super_SectionParser)._vptr_SectionParser = (_func_int **)&PTR__SectionParser_002f2320;
  std::__cxx11::string::string<std::allocator<char>>(local_30,"InversionTypes",&local_31);
  std::__cxx11::string::_M_assign((string *)&(this->super_SectionParser).sectionName_);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

InversionTypesSectionParser::InversionTypesSectionParser(ForceFieldOptions&) {
    setSectionName("InversionTypes");
  }